

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O3

void __thiscall
btTranslationalLimitMotor2::testLimitValue
          (btTranslationalLimitMotor2 *this,int limitIndex,btScalar test_value)

{
  float fVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  float fVar5;
  
  lVar2 = (long)limitIndex;
  fVar1 = (this->m_lowerLimit).m_floats[lVar2];
  fVar5 = (this->m_upperLimit).m_floats[lVar2];
  if (fVar1 <= fVar5) {
    (this->m_currentLimitError).m_floats[lVar2] = test_value - fVar1;
    iVar3 = 3;
    if ((fVar1 == fVar5) && (!NAN(fVar1) && !NAN(fVar5))) goto LAB_00195282;
    fVar5 = test_value - fVar5;
    iVar3 = 4;
    lVar4 = 0xf4;
  }
  else {
    iVar3 = 0;
    fVar5 = 0.0;
    lVar4 = 0xe4;
  }
  *(float *)((long)(this->m_lowerLimit).m_floats + lVar2 * 4 + lVar4) = fVar5;
LAB_00195282:
  this->m_currentLimit[lVar2] = iVar3;
  return;
}

Assistant:

void btTranslationalLimitMotor2::testLimitValue(int limitIndex, btScalar test_value)
{
	btScalar loLimit = m_lowerLimit[limitIndex];
	btScalar hiLimit = m_upperLimit[limitIndex];
	if(loLimit > hiLimit) {
		m_currentLimitError[limitIndex] = 0;
		m_currentLimit[limitIndex] = 0;
	}
	else if(loLimit == hiLimit) {
		m_currentLimitError[limitIndex] = test_value - loLimit;
		m_currentLimit[limitIndex] = 3;
	} else {
		m_currentLimitError[limitIndex] = test_value - loLimit;
		m_currentLimitErrorHi[limitIndex] = test_value - hiLimit;
		m_currentLimit[limitIndex] = 4;
	}
}